

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_arena.h
# Opt level: O1

void __thiscall
ArenaVectorBase<ArenaVector<bool>,bool>::set<std::vector<bool,std::allocator<bool>>>
          (ArenaVectorBase<ArenaVector<bool>,bool> *this,vector<bool,_std::allocator<bool>_> *list)

{
  ulong size;
  uint uVar1;
  ulong *puVar2;
  void *pvVar3;
  ulong *puVar4;
  long lVar5;
  int iVar6;
  ulong uVar7;
  vector<bool,_std::allocator<bool>_> *__range2;
  
  size = (ulong)(list->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
                _M_finish.super__Bit_iterator_base._M_offset +
         ((long)(list->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
                _M_finish.super__Bit_iterator_base._M_p -
         (long)(list->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
               _M_start.super__Bit_iterator_base._M_p) * 8;
  if (*(ulong *)(this + 0x10) < size) {
    *(ulong *)(this + 0x10) = size;
    pvVar3 = MixedArena::allocSpace(*(MixedArena **)(this + 0x18),size,1);
    *(void **)this = pvVar3;
  }
  puVar4 = (list->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p;
  puVar2 = (list->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
           _M_finish.super__Bit_iterator_base._M_p;
  uVar1 = (list->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
          _M_finish.super__Bit_iterator_base._M_offset;
  if (uVar1 != 0 || puVar4 != puVar2) {
    lVar5 = *(long *)this;
    uVar7 = 0;
    do {
      *(bool *)lVar5 = (*puVar4 >> (uVar7 & 0x3f) & 1) != 0;
      iVar6 = (int)uVar7;
      puVar4 = puVar4 + (iVar6 == 0x3f);
      uVar7 = (ulong)(iVar6 + 1);
      if (iVar6 == 0x3f) {
        uVar7 = 0;
      }
      lVar5 = lVar5 + 1;
    } while ((uint)uVar7 != uVar1 || puVar4 != puVar2);
  }
  *(ulong *)(this + 8) = size;
  return;
}

Assistant:

void set(const ListType& list) {
    size_t size = list.size();
    if (allocatedElements < size) {
      static_cast<SubType*>(this)->allocate(size);
    }
    size_t i = 0;
    for (auto elem : list) {
      data[i++] = elem;
    }
    usedElements = size;
  }